

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void Js::JavascriptExceptionOperators::AddStackTraceToObject
               (Var targetObject,StackTrace *stackTrace,ScriptContext *scriptContext,
               bool isThrownException,bool resetStack)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  ScriptConfiguration *this;
  undefined4 *puVar5;
  RecyclableObject *this_00;
  JavascriptLibrary *this_01;
  JavascriptFunction *setter;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  Var errorObject;
  JavascriptExceptionObject *exceptionObject;
  JavascriptException *err;
  AutoNestedHandledExceptionType local_70 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  PropertyDescriptor stackPropertyDescriptor;
  JavascriptFunction *accessor;
  RecyclableObject *obj;
  bool resetStack_local;
  bool isThrownException_local;
  ScriptContext *scriptContext_local;
  StackTrace *stackTrace_local;
  Var targetObject_local;
  
  if (stackTrace != (StackTrace *)0x0) {
    this = ScriptContext::GetConfig(scriptContext);
    bVar2 = ScriptConfiguration::IsErrorStackTraceEnabled(this);
    if (((bVar2) &&
        ((iVar3 = JsUtil::
                  ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                  ::Count(&stackTrace->
                           super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                         ), iVar3 != 0 || (bVar2 = IsErrorInstance(targetObject), bVar2)))) &&
       ((scriptContext_local = (ScriptContext *)stackTrace, !isThrownException ||
        ((bVar2 = CrawlStackForWER(scriptContext), !bVar2 ||
         (scriptContext_local =
               (ScriptContext *)TrimStackTraceForThrownObject(stackTrace,targetObject,scriptContext)
         , scriptContext_local != (ScriptContext *)0x0)))))) {
      if ((isThrownException) && (bVar2 = IsErrorInstance(targetObject), !bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                           ,0x5d8,"(!isThrownException || IsErrorInstance(targetObject))",
                           "!isThrownException || IsErrorInstance(targetObject)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_00 = VarTo<Js::RecyclableObject>(targetObject);
      if ((resetStack) || (BVar4 = RecyclableObject::HasProperty(this_00,0x161), BVar4 == 0)) {
        this_01 = ScriptContext::GetLibrary(scriptContext);
        setter = JavascriptLibrary::GetStackTraceAccessorFunction(this_01);
        PropertyDescriptor::PropertyDescriptor
                  ((PropertyDescriptor *)&__autoNestedHandledExceptionType);
        PropertyDescriptor::SetSetter
                  ((PropertyDescriptor *)&__autoNestedHandledExceptionType,setter);
        PropertyDescriptor::SetGetter
                  ((PropertyDescriptor *)&__autoNestedHandledExceptionType,setter);
        PropertyDescriptor::SetConfigurable
                  ((PropertyDescriptor *)&__autoNestedHandledExceptionType,true);
        PropertyDescriptor::SetEnumerable
                  ((PropertyDescriptor *)&__autoNestedHandledExceptionType,false);
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (local_70,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                            ExceptionType_OutOfMemory);
        BVar4 = Js::JavascriptOperators::DefineOwnPropertyDescriptor
                          (this_00,0x161,(PropertyDescriptor *)&__autoNestedHandledExceptionType,
                           false,scriptContext,PropertyOperation_None);
        if (BVar4 != 0) {
          (*(this_00->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x19])(this_00,5,scriptContext_local,0,0);
          (*(this_00->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x19])(this_00,6,0);
        }
        BVar4 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                             ,0x5ef,"(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                             "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_70);
      }
    }
  }
  return;
}

Assistant:

void JavascriptExceptionOperators::AddStackTraceToObject(Var targetObject, JavascriptExceptionContext::StackTrace* stackTrace, ScriptContext& scriptContext, bool isThrownException, bool resetStack)
    {
        if (!stackTrace || !scriptContext.GetConfig()->IsErrorStackTraceEnabled())
        {
            return;
        }

        if (stackTrace->Count() == 0 && !IsErrorInstance(targetObject))
        {
            return;
        }

        if (isThrownException && CrawlStackForWER(scriptContext)) // Trim stack trace for WER
        {
            stackTrace = TrimStackTraceForThrownObject(stackTrace, targetObject, scriptContext);
            if (!stackTrace)
            {
                return;
            }
        }

        // If we still have stack trace to store and obj is a thrown exception object, obj must be an Error instance.
        Assert(!isThrownException || IsErrorInstance(targetObject));

        RecyclableObject* obj = VarTo<RecyclableObject>(targetObject);
        if (!resetStack && obj->HasProperty(PropertyIds::stack))
        {
            return; // we don't want to overwrite an existing "stack" property
        }

        JavascriptFunction* accessor = scriptContext.GetLibrary()->GetStackTraceAccessorFunction();
        PropertyDescriptor stackPropertyDescriptor;
        stackPropertyDescriptor.SetSetter(accessor);
        stackPropertyDescriptor.SetGetter(accessor);
        stackPropertyDescriptor.SetConfigurable(true);
        stackPropertyDescriptor.SetEnumerable(false);
        HRESULT hr;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            if (JavascriptOperators::DefineOwnPropertyDescriptor(obj, PropertyIds::stack, stackPropertyDescriptor, false, &scriptContext))
            {
                obj->SetInternalProperty(InternalPropertyIds::StackTrace, stackTrace, PropertyOperationFlags::PropertyOperation_None, NULL);
                obj->SetInternalProperty(InternalPropertyIds::StackTraceCache, NULL, PropertyOperationFlags::PropertyOperation_None, NULL);
            }
        }
        END_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_INSCRIPT(hr)
    }